

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# psa_crypto.c
# Opt level: O0

mbedtls_ecp_group_id mbedtls_ecc_group_of_psa(psa_ecc_curve_t curve,size_t byte_length)

{
  size_t byte_length_local;
  psa_ecc_curve_t curve_local;
  
  if (curve == '\x12') {
    switch(byte_length) {
    case 0x18:
      byte_length_local._4_4_ = MBEDTLS_ECP_DP_SECP192R1;
      break;
    default:
      byte_length_local._4_4_ = MBEDTLS_ECP_DP_NONE;
      break;
    case 0x1c:
      byte_length_local._4_4_ = MBEDTLS_ECP_DP_SECP224R1;
      break;
    case 0x20:
      byte_length_local._4_4_ = MBEDTLS_ECP_DP_SECP256R1;
      break;
    case 0x30:
      byte_length_local._4_4_ = MBEDTLS_ECP_DP_SECP384R1;
      break;
    case 0x42:
      byte_length_local._4_4_ = MBEDTLS_ECP_DP_SECP521R1;
    }
  }
  else if (curve == '\x17') {
    if (byte_length == 0x18) {
      byte_length_local._4_4_ = MBEDTLS_ECP_DP_SECP192K1;
    }
    else if (byte_length == 0x1c) {
      byte_length_local._4_4_ = MBEDTLS_ECP_DP_SECP224K1;
    }
    else if (byte_length == 0x20) {
      byte_length_local._4_4_ = MBEDTLS_ECP_DP_SECP256K1;
    }
    else {
      byte_length_local._4_4_ = MBEDTLS_ECP_DP_NONE;
    }
  }
  else if (curve == '0') {
    if (byte_length == 0x20) {
      byte_length_local._4_4_ = MBEDTLS_ECP_DP_BP256R1;
    }
    else if (byte_length == 0x30) {
      byte_length_local._4_4_ = MBEDTLS_ECP_DP_BP384R1;
    }
    else if (byte_length == 0x40) {
      byte_length_local._4_4_ = MBEDTLS_ECP_DP_BP512R1;
    }
    else {
      byte_length_local._4_4_ = MBEDTLS_ECP_DP_NONE;
    }
  }
  else if (curve == 'A') {
    if (byte_length == 0x20) {
      byte_length_local._4_4_ = MBEDTLS_ECP_DP_CURVE25519;
    }
    else if (byte_length == 0x38) {
      byte_length_local._4_4_ = MBEDTLS_ECP_DP_CURVE448;
    }
    else {
      byte_length_local._4_4_ = MBEDTLS_ECP_DP_NONE;
    }
  }
  else {
    byte_length_local._4_4_ = MBEDTLS_ECP_DP_NONE;
  }
  return byte_length_local._4_4_;
}

Assistant:

mbedtls_ecp_group_id mbedtls_ecc_group_of_psa( psa_ecc_curve_t curve,
                                               size_t byte_length )
{
    switch( curve )
    {
        case PSA_ECC_CURVE_SECP_R1:
            switch( byte_length )
            {
                case PSA_BITS_TO_BYTES( 192 ):
                    return( MBEDTLS_ECP_DP_SECP192R1 );
                case PSA_BITS_TO_BYTES( 224 ):
                    return( MBEDTLS_ECP_DP_SECP224R1 );
                case PSA_BITS_TO_BYTES( 256 ):
                    return( MBEDTLS_ECP_DP_SECP256R1 );
                case PSA_BITS_TO_BYTES( 384 ):
                    return( MBEDTLS_ECP_DP_SECP384R1 );
                case PSA_BITS_TO_BYTES( 521 ):
                    return( MBEDTLS_ECP_DP_SECP521R1 );
                default:
                    return( MBEDTLS_ECP_DP_NONE );
            }
            break;

        case PSA_ECC_CURVE_BRAINPOOL_P_R1:
            switch( byte_length )
            {
                case PSA_BITS_TO_BYTES( 256 ):
                    return( MBEDTLS_ECP_DP_BP256R1 );
                case PSA_BITS_TO_BYTES( 384 ):
                    return( MBEDTLS_ECP_DP_BP384R1 );
                case PSA_BITS_TO_BYTES( 512 ):
                    return( MBEDTLS_ECP_DP_BP512R1 );
                default:
                    return( MBEDTLS_ECP_DP_NONE );
            }
            break;

        case PSA_ECC_CURVE_MONTGOMERY:
            switch( byte_length )
            {
                case PSA_BITS_TO_BYTES( 255 ):
                    return( MBEDTLS_ECP_DP_CURVE25519 );
                case PSA_BITS_TO_BYTES( 448 ):
                    return( MBEDTLS_ECP_DP_CURVE448 );
                default:
                    return( MBEDTLS_ECP_DP_NONE );
            }
            break;

        case PSA_ECC_CURVE_SECP_K1:
            switch( byte_length )
            {
                case PSA_BITS_TO_BYTES( 192 ):
                    return( MBEDTLS_ECP_DP_SECP192K1 );
                case PSA_BITS_TO_BYTES( 224 ):
                    return( MBEDTLS_ECP_DP_SECP224K1 );
                case PSA_BITS_TO_BYTES( 256 ):
                    return( MBEDTLS_ECP_DP_SECP256K1 );
                default:
                    return( MBEDTLS_ECP_DP_NONE );
            }
            break;

        default:
            return( MBEDTLS_ECP_DP_NONE );
    }
}